

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O0

Result __thiscall wabt::TypeChecker::OnIndexedFuncRef(TypeChecker *this,Index *out_index)

{
  bool bVar1;
  Result rhs;
  Index IVar2;
  Type local_30;
  Type local_28;
  Type type;
  Index *out_index_local;
  TypeChecker *this_local;
  Result result;
  
  type = (Type)out_index;
  this_local._4_4_ = PeekType(this,0,&local_28);
  bVar1 = Type::IsReferenceWithIndex(&local_28);
  if (!bVar1) {
    Type::Type(&local_30,Reference,0xffffffff);
    local_28 = local_30;
  }
  rhs = PopAndCheck1Type(this,local_28,"call_ref");
  Result::operator|=((Result *)((long)&this_local + 4),rhs);
  bVar1 = Succeeded(this_local._4_4_);
  if (bVar1) {
    IVar2 = Type::GetReferenceIndex(&local_28);
    *(Index *)type = IVar2;
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result TypeChecker::OnIndexedFuncRef(Index* out_index) {
  Type type;
  Result result = PeekType(0, &type);
  if (!type.IsReferenceWithIndex()) {
    type = Type(Type::Reference, kInvalidIndex);
  }
  result |= PopAndCheck1Type(type, "call_ref");
  if (Succeeded(result)) {
    *out_index = type.GetReferenceIndex();
  }
  return result;
}